

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool Interpreter::Equals(string *a,string *b)

{
  __type _Var1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  undefined1 local_58 [8];
  string bb;
  string aa;
  string *b_local;
  string *a_local;
  
  std::__cxx11::string::string((string *)(bb.field_2._M_local_buf + 8),(string *)a);
  std::__cxx11::string::string((string *)local_58,(string *)b);
  _Var2._M_current = (char *)std::__cxx11::string::begin();
  _Var3._M_current = (char *)std::__cxx11::string::end();
  _Var4._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (_Var2,_Var3,_Var4,tolower);
  _Var2._M_current = (char *)std::__cxx11::string::begin();
  _Var3._M_current = (char *)std::__cxx11::string::end();
  _Var4._M_current = (char *)std::__cxx11::string::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
            (_Var2,_Var3,_Var4,tolower);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&bb.field_2 + 8),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(bb.field_2._M_local_buf + 8));
  return _Var1;
}

Assistant:

bool Interpreter::Equals(const std::string& a, const std::string& b)
{
    std::string aa = a, bb = b;
    std::transform(aa.begin(), aa.end(), aa.begin(), ::tolower);
    std::transform(bb.begin(), bb.end(), bb.begin(), ::tolower);
    return aa == bb;
}